

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

string * __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_temp<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,writer_base<cppwinrt::writer> *this,string_view *value,
          basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  uint32_t uVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  allocator local_3a;
  undefined1 local_39;
  size_type local_38;
  size_type size;
  basic_string_view<char,_std::char_traits<char>_> *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  string *result;
  
  size = (size_type)args_1;
  args_local_1 = args;
  args_local = value;
  value_local = (string_view *)this;
  this_local = (writer_base<cppwinrt::writer> *)__return_storage_ptr__;
  local_38 = std::vector<char,_std::allocator<char>_>::size(&this->m_first);
  uVar1 = count_placeholders(args_local);
  if (uVar1 != 2) {
    __assert_fail("count_placeholders(value) == sizeof...(Args)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x32,
                  "std::string cppwinrt::writer_base<cppwinrt::writer>::write_temp(const std::string_view &, const Args &...) [T = cppwinrt::writer, Args = <std::basic_string_view<char>, std::basic_string_view<char>>]"
                 );
  }
  write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (this,args_local,args_local_1,(basic_string_view<char,_std::char_traits<char>_> *)size);
  local_39 = 0;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->m_first);
  pcVar2 = pcVar2 + local_38;
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->m_first);
  uVar4 = sVar3 - local_38;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar4,&local_3a);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  std::vector<char,_std::allocator<char>_>::resize(&this->m_first,local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string write_temp(std::string_view const& value, Args const&... args)
        {
#if defined(_DEBUG)
            bool restore_debug_trace = debug_trace;
            debug_trace = false;
#endif
            auto const size = m_first.size();

            assert(count_placeholders(value) == sizeof...(Args));
            write_segment(value, args...);

            std::string result{ m_first.data() + size, m_first.size() - size };
            m_first.resize(size);

#if defined(_DEBUG)
            debug_trace = restore_debug_trace;
#endif
            return result;
        }